

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler::handle
          (AnalyzeVariableScopeAccessHandler *this,Op op,uint32_t *args,uint32_t length)

{
  Compiler *pCVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  pointer ppVar5;
  mapped_type *pmVar6;
  Variant *this_00;
  size_type sVar7;
  SPIRType *pSVar8;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *ppVar9;
  SPIRExtension *pSVar10;
  value_type *__x;
  value_type *__x_00;
  value_type *__x_01;
  value_type *__x_02;
  value_type *__x_03;
  value_type *__x_04;
  value_type *__x_05;
  value_type *__x_06;
  value_type *__x_07;
  value_type *__x_08;
  value_type *__x_09;
  value_type *__x_10;
  value_type *__x_11;
  value_type *__x_12;
  value_type *__x_13;
  value_type *__x_14;
  value_type *__x_15;
  value_type *__x_16;
  value_type *__x_17;
  value_type *__x_18;
  value_type *__x_19;
  value_type *__x_20;
  uint local_310;
  uint local_30c;
  uint32_t i_10;
  uint32_t i_9;
  uint32_t i_8;
  uint32_t i_7;
  uint32_t i_6;
  uint32_t i_5;
  undefined1 local_2e8 [28];
  uint32_t local_2cc;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *local_2c8;
  undefined1 local_2b8 [16];
  SPIRVariable *var_7;
  uint32_t ptr_3;
  GLSLstd450 op_450;
  uint32_t extension_set;
  uint32_t i_4;
  undefined1 local_288 [28];
  uint32_t local_26c;
  SPIRVariable *local_268;
  SPIRVariable *var_6;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *ppStack_258;
  uint32_t i_3;
  undefined1 local_248 [28];
  uint32_t local_22c;
  SPIRVariable *local_228;
  SPIRVariable *var_5;
  uint32_t i_2;
  SPIRType *local_208;
  SPIRType *type_1;
  undefined1 local_1f0 [16];
  SPIRVariable *var_4;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *ppStack_1d8;
  uint32_t ptr_2;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *local_1c8;
  undefined1 local_1b8 [16];
  SPIRVariable *var_3;
  SPIRType *type;
  uint32_t local_18c;
  uint32_t local_188;
  uint local_184;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *ppStack_180;
  uint32_t i_1;
  undefined1 local_170 [4];
  float local_16c;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *local_168;
  undefined1 local_158 [28];
  uint32_t local_13c;
  SPIRVariable *local_138;
  SPIRVariable *var_2;
  ID rhs;
  ID lhs;
  TypedID<(diligent_spirv_cross::Types)2> local_114;
  SPIRVariable *local_110;
  SPIRVariable *backing_variable;
  SPIRExpression *local_100;
  SPIRExpression *e;
  uint local_e4;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *ppStack_e0;
  uint32_t i;
  undefined1 local_cc [24];
  uint32_t local_b4;
  SPIRVariable *local_b0;
  SPIRVariable *var_1;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *ppStack_a0;
  uint32_t ptr_1;
  undefined1 local_90 [28];
  uint32_t local_74;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *local_70;
  undefined1 local_60 [16];
  SPIRVariable *var;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Stack_48;
  ID ptr;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_40;
  iterator itr;
  uint32_t local_30;
  uint32_t result_id;
  uint32_t result_type;
  uint32_t length_local;
  uint32_t *args_local;
  AnalyzeVariableScopeAccessHandler *pAStack_18;
  Op op_local;
  AnalyzeVariableScopeAccessHandler *this_local;
  
  local_30 = 0;
  itr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._4_4_ = 0
  ;
  result_id = length;
  _result_type = args;
  args_local._4_4_ = op;
  pAStack_18 = this;
  bVar2 = instruction_to_result_type
                    (this->compiler,&local_30,
                     (uint32_t *)
                     ((long)&itr.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                             ._M_cur + 4),op,args,length);
  if (bVar2) {
    if (args_local._4_4_ == OpConvertUToAccelerationStructureKHR) {
      local_40._M_cur =
           (__node_type *)
           ::std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::find(&this->result_id_to_type,_result_type + 2);
      _Stack_48._M_cur =
           (__node_type *)
           ::std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::end(&this->result_id_to_type);
      bVar2 = ::std::__detail::operator!=(&local_40,&stack0xffffffffffffffb8);
      if (bVar2) {
        ppVar5 = ::std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                             *)&local_40);
        local_30 = ppVar5->second;
      }
    }
    uVar3 = local_30;
    pmVar6 = ::std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->result_id_to_type,
                          (key_type *)
                          ((long)&itr.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                  ._M_cur + 4));
    *pmVar6 = uVar3;
  }
  switch(args_local._4_4_) {
  case OpLine:
  case OpNoLine:
    break;
  default:
    for (local_310 = 0; local_310 < result_id; local_310 = local_310 + 1) {
      uVar3 = _result_type[local_310];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    break;
  case OpExtInst:
    for (op_450 = GLSLstd450FAbs; op_450 < result_id; op_450 = op_450 + GLSLstd450Round) {
      uVar3 = _result_type[op_450];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    uVar3 = _result_type[1];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    ptr_3 = _result_type[2];
    pSVar10 = get<diligent_spirv_cross::SPIRExtension>(this->compiler,ptr_3);
    if ((*(int *)&(pSVar10->super_IVariant).field_0xc == 1) &&
       (var_7._4_4_ = _result_type[3], (var_7._4_4_ | 0x10) == 0x33)) {
      var_7._0_4_ = _result_type[5];
      local_2b8._8_8_ = maybe_get_backing_variable(this->compiler,(uint32_t)var_7);
      if ((SPIRVariable *)local_2b8._8_8_ != (SPIRVariable *)0x0) {
        local_2b8._4_4_ =
             TypedID::operator_cast_to_unsigned_int
                       ((TypedID *)&(((SPIRVariable *)local_2b8._8_8_)->super_IVariant).self);
        ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                 ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->accessed_variables_to_block,(key_type *)(local_2b8 + 4));
        local_2b8._0_4_ =
             TypedID::operator_cast_to_unsigned_int
                       ((TypedID *)&(this->current_block->super_IVariant).self);
        local_2c8 = ::std::
                    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                     *)local_2b8,__x_18);
        uVar3 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&((IVariant *)local_2b8._8_8_)->self);
        if (uVar3 == (uint32_t)var_7) {
          local_2cc = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&((IVariant *)local_2b8._8_8_)->self);
          ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                   ::std::
                   unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                   ::operator[](&this->complete_write_variables_to_block,&local_2cc);
          local_2e8._24_4_ =
               TypedID::operator_cast_to_unsigned_int
                         ((TypedID *)&(this->current_block->super_IVariant).self);
          ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)(local_2e8 + 0x18),__x_19);
        }
        else {
          local_2e8._4_4_ =
               TypedID::operator_cast_to_unsigned_int
                         ((TypedID *)&((IVariant *)local_2b8._8_8_)->self);
          ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                   ::std::
                   unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                   ::operator[](&this->partial_write_variables_to_block,(key_type *)(local_2e8 + 4))
          ;
          local_2e8._0_4_ =
               TypedID::operator_cast_to_unsigned_int
                         ((TypedID *)&(this->current_block->super_IVariant).self);
          ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)local_2e8,__x_20);
        }
      }
    }
    break;
  case OpFunctionCall:
    if (result_id < 3) {
      return false;
    }
    pCVar1 = this->compiler;
    TypedID<(diligent_spirv_cross::Types)1>::TypedID
              ((TypedID<(diligent_spirv_cross::Types)1> *)((long)&var_5 + 4),*_result_type);
    pSVar8 = get_type(pCVar1,var_5._4_4_);
    if (pSVar8->basetype != Void) {
      uVar3 = _result_type[1];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    result_id = result_id - 3;
    _result_type = _result_type + 3;
    for (var_5._0_4_ = 0; (uint)var_5 < result_id; var_5._0_4_ = (uint)var_5 + 1) {
      local_228 = maybe_get_backing_variable(this->compiler,_result_type[(uint)var_5]);
      if (local_228 != (SPIRVariable *)0x0) {
        local_22c = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(local_228->super_IVariant).self);
        ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                 ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->accessed_variables_to_block,&local_22c);
        local_248._24_4_ =
             TypedID::operator_cast_to_unsigned_int
                       ((TypedID *)&(this->current_block->super_IVariant).self);
        local_248._8_8_ =
             ::std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)(local_248 + 0x18),__x_14);
        local_248._4_4_ =
             TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_228->super_IVariant).self);
        ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                 ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->partial_write_variables_to_block,(key_type *)(local_248 + 4));
        local_248._0_4_ =
             TypedID::operator_cast_to_unsigned_int
                       ((TypedID *)&(this->current_block->super_IVariant).self);
        ppStack_258 = ::std::
                      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                       *)local_248,__x_15);
      }
      uVar3 = _result_type[(uint)var_5];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    break;
  case OpLoad:
    if (result_id < 3) {
      return false;
    }
    var_4._4_4_ = _result_type[2];
    local_1f0._8_8_ = maybe_get_backing_variable(this->compiler,var_4._4_4_);
    if ((SPIRVariable *)local_1f0._8_8_ != (SPIRVariable *)0x0) {
      local_1f0._4_4_ =
           TypedID::operator_cast_to_unsigned_int
                     ((TypedID *)&(((SPIRVariable *)local_1f0._8_8_)->super_IVariant).self);
      ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
               ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->accessed_variables_to_block,(key_type *)(local_1f0 + 4));
      local_1f0._0_4_ =
           TypedID::operator_cast_to_unsigned_int
                     ((TypedID *)&(this->current_block->super_IVariant).self);
      type_1 = (SPIRType *)
               ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)local_1f0,__x_12);
    }
    uVar3 = _result_type[1];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    uVar3 = _result_type[2];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    local_208 = get<diligent_spirv_cross::SPIRType>(this->compiler,*_result_type);
    bVar2 = type_is_opaque_value(this->compiler,local_208);
    if (bVar2) {
      ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
               ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->rvalue_forward_children,_result_type + 1);
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)(_result_type + 2),__x_13);
    }
    break;
  case OpStore:
    if (result_id < 2) {
      return false;
    }
    TypedID<(diligent_spirv_cross::Types)0>::TypedID
              ((TypedID<(diligent_spirv_cross::Types)0> *)((long)&var + 4),*_result_type);
    pCVar1 = this->compiler;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&var + 4));
    local_60._8_8_ = maybe_get_backing_variable(pCVar1,uVar3);
    if ((SPIRVariable *)local_60._8_8_ != (SPIRVariable *)0x0) {
      local_60._4_4_ =
           TypedID::operator_cast_to_unsigned_int
                     ((TypedID *)&(((SPIRVariable *)local_60._8_8_)->super_IVariant).self);
      ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
               ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->accessed_variables_to_block,(key_type *)(local_60 + 4));
      local_60._0_4_ =
           TypedID::operator_cast_to_unsigned_int
                     ((TypedID *)&(this->current_block->super_IVariant).self);
      local_70 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                  *)local_60,__x);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&((IVariant *)local_60._8_8_)->self)
      ;
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&var + 4));
      if (uVar3 == uVar4) {
        local_74 = TypedID::operator_cast_to_unsigned_int
                             ((TypedID *)&((IVariant *)local_60._8_8_)->self);
        ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                 ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->complete_write_variables_to_block,&local_74);
        local_90._24_4_ =
             TypedID::operator_cast_to_unsigned_int
                       ((TypedID *)&(this->current_block->super_IVariant).self);
        local_90._8_8_ =
             ::std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)(local_90 + 0x18),__x_00);
      }
      else {
        local_90._4_4_ =
             TypedID::operator_cast_to_unsigned_int((TypedID *)&((IVariant *)local_60._8_8_)->self);
        ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                 ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->partial_write_variables_to_block,(key_type *)(local_90 + 4));
        local_90._0_4_ =
             TypedID::operator_cast_to_unsigned_int
                       ((TypedID *)&(this->current_block->super_IVariant).self);
        ppStack_a0 = ::std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                      *)local_90,__x_01);
      }
    }
    uVar3 = *_result_type;
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    uVar3 = _result_type[1];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    break;
  case OpCopyMemory:
    if (result_id < 2) {
      return false;
    }
    TypedID<(diligent_spirv_cross::Types)0>::TypedID
              ((TypedID<(diligent_spirv_cross::Types)0> *)((long)&var_2 + 4),*_result_type);
    TypedID<(diligent_spirv_cross::Types)0>::TypedID
              ((TypedID<(diligent_spirv_cross::Types)0> *)&var_2,_result_type[1]);
    pCVar1 = this->compiler;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&var_2 + 4));
    local_138 = maybe_get_backing_variable(pCVar1,uVar3);
    if (local_138 != (SPIRVariable *)0x0) {
      local_13c = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(local_138->super_IVariant).self);
      ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
               ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->accessed_variables_to_block,&local_13c);
      local_158._24_4_ =
           TypedID::operator_cast_to_unsigned_int
                     ((TypedID *)&(this->current_block->super_IVariant).self);
      local_158._8_8_ =
           ::std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)(local_158 + 0x18),__x_06);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_138->super_IVariant).self);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&var_2 + 4));
      if (uVar3 == uVar4) {
        local_158._4_4_ =
             TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_138->super_IVariant).self);
        ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                 ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->complete_write_variables_to_block,(key_type *)(local_158 + 4));
        local_158._0_4_ =
             TypedID::operator_cast_to_unsigned_int
                       ((TypedID *)&(this->current_block->super_IVariant).self);
        local_168 = ::std::
                    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                     *)local_158,__x_07);
      }
      else {
        local_16c = (float)TypedID::operator_cast_to_unsigned_int
                                     ((TypedID *)&(local_138->super_IVariant).self);
        ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                 ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->partial_write_variables_to_block,(key_type *)&local_16c);
        local_170 = (undefined1  [4])
                    TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(this->current_block->super_IVariant).self);
        ppStack_180 = ::std::
                      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                       *)local_170,__x_08);
      }
    }
    for (local_184 = 0; local_184 < 2; local_184 = local_184 + 1) {
      uVar3 = _result_type[local_184];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    pCVar1 = this->compiler;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_2);
    local_138 = maybe_get_backing_variable(pCVar1,uVar3);
    if (local_138 != (SPIRVariable *)0x0) {
      local_188 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(local_138->super_IVariant).self);
      ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
               ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->accessed_variables_to_block,&local_188);
      local_18c = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(this->current_block->super_IVariant).self);
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&stack0xfffffffffffffe74,__x_09);
    }
    break;
  case OpAccessChain:
  case OpInBoundsAccessChain:
  case OpPtrAccessChain:
    if (result_id < 3) {
      return false;
    }
    var_1._4_4_ = _result_type[2];
    local_b0 = maybe_get<diligent_spirv_cross::SPIRVariable>(this->compiler,var_1._4_4_);
    if (local_b0 != (SPIRVariable *)0x0) {
      local_b4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_b0->super_IVariant).self)
      ;
      ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
               ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->accessed_variables_to_block,&local_b4);
      local_cc._20_4_ =
           TypedID::operator_cast_to_unsigned_int
                     ((TypedID *)&(this->current_block->super_IVariant).self);
      local_cc._4_8_ =
           ::std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)(local_cc + 0x14),__x_02);
      ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
               ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->rvalue_forward_children,_result_type + 1);
      local_cc._0_4_ =
           TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_b0->super_IVariant).self);
      ppStack_e0 = ::std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                    *)local_cc,__x_03);
    }
    for (local_e4 = 2; local_e4 < result_id; local_e4 = local_e4 + 1) {
      uVar3 = _result_type[local_e4];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
      ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
               ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->rvalue_forward_children,_result_type + 1);
      e = (SPIRExpression *)
          ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)(_result_type + local_e4),__x_04);
    }
    uVar3 = _result_type[1];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    backing_variable._7_1_ = 1;
    local_100 = set<diligent_spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int_const&,bool>
                          (this->compiler,_result_type[1],(char (*) [1])0xe30c4c,_result_type,
                           (bool *)((long)&backing_variable + 7));
    local_110 = maybe_get_backing_variable(this->compiler,var_1._4_4_);
    if (local_110 == (SPIRVariable *)0x0) {
      TypedID<(diligent_spirv_cross::Types)2>::TypedID(&local_114,0);
    }
    else {
      TypedID<(diligent_spirv_cross::Types)2>::TypedID(&local_114,&(local_110->super_IVariant).self)
      ;
    }
    TypedID<(diligent_spirv_cross::Types)0>::operator=(&local_100->loaded_from,&local_114);
    this_00 = VectorView<diligent_spirv_cross::Variant>::operator[]
                        (&(this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>,
                         (ulong)_result_type[1]);
    Variant::set_allow_type_rewrite(this_00);
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
             &this->access_chain_expressions,
             (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)(_result_type + 1),__x_05);
    break;
  case OpArrayLength:
    uVar3 = _result_type[1];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    break;
  case OpVectorShuffle:
  case OpCompositeInsert:
    for (i_7 = 1; i_7 < 4; i_7 = i_7 + 1) {
      uVar3 = _result_type[i_7];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    break;
  case OpCompositeExtract:
    for (i_8 = 1; i_8 < 3; i_8 = i_8 + 1) {
      uVar3 = _result_type[i_8];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
    break;
  case OpCopyObject:
    var_3 = (SPIRVariable *)get<diligent_spirv_cross::SPIRType>(this->compiler,local_30);
    if ((((SPIRType *)var_3)->pointer & 1U) != 0) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&((SPIRType *)var_3)->parent_type);
      pmVar6 = ::std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->result_id_to_type,
                            (key_type *)
                            ((long)&itr.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                    ._M_cur + 4));
      *pmVar6 = uVar3;
    }
    if (result_id < 3) {
      return false;
    }
    local_1b8._8_8_ = maybe_get_backing_variable(this->compiler,_result_type[2]);
    if ((SPIRVariable *)local_1b8._8_8_ != (SPIRVariable *)0x0) {
      local_1b8._4_4_ =
           TypedID::operator_cast_to_unsigned_int
                     ((TypedID *)&(((SPIRVariable *)local_1b8._8_8_)->super_IVariant).self);
      ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
               ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->accessed_variables_to_block,(key_type *)(local_1b8 + 4));
      local_1b8._0_4_ =
           TypedID::operator_cast_to_unsigned_int
                     ((TypedID *)&(this->current_block->super_IVariant).self);
      local_1c8 = ::std::
                  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)local_1b8,__x_10);
    }
    uVar3 = _result_type[1];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    sVar7 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->access_chain_expressions,_result_type + 2);
    if (sVar7 != 0) {
      ppStack_1d8 = ::std::
                    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *
                             )&this->access_chain_expressions,
                             (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)(_result_type + 1),__x_11);
    }
    uVar3 = _result_type[2];
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->current_block->super_IVariant).self);
    notify_variable_access(this,uVar3,uVar4);
    break;
  case OpImageSampleImplicitLod:
  case OpImageSampleExplicitLod:
  case OpImageSampleProjImplicitLod:
  case OpImageSampleProjExplicitLod:
  case OpImageFetch:
  case OpImageRead:
  case OpImageSparseSampleImplicitLod:
  case OpImageSparseSampleExplicitLod:
  case OpImageSparseSampleProjImplicitLod:
  case OpImageSparseSampleProjExplicitLod:
  case OpImageSparseFetch:
  case OpImageSparseRead:
    for (i_10 = 1; i_10 < result_id; i_10 = i_10 + 1) {
      if (i_10 != 4) {
        uVar3 = _result_type[i_10];
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(this->current_block->super_IVariant).self);
        notify_variable_access(this,uVar3,uVar4);
      }
    }
    break;
  case OpImageSampleDrefImplicitLod:
  case OpImageSampleDrefExplicitLod:
  case OpImageSampleProjDrefImplicitLod:
  case OpImageSampleProjDrefExplicitLod:
  case OpImageGather:
  case OpImageDrefGather:
  case OpImageSparseSampleDrefImplicitLod:
  case OpImageSparseSampleDrefExplicitLod:
  case OpImageSparseSampleProjDrefImplicitLod:
  case OpImageSparseSampleProjDrefExplicitLod:
  case OpImageSparseGather:
  case OpImageSparseDrefGather:
    for (local_30c = 1; local_30c < result_id; local_30c = local_30c + 1) {
      if (local_30c != 5) {
        uVar3 = _result_type[local_30c];
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(this->current_block->super_IVariant).self);
        notify_variable_access(this,uVar3,uVar4);
      }
    }
    break;
  case OpImageWrite:
    for (i_9 = 0; i_9 < result_id; i_9 = i_9 + 1) {
      if (i_9 != 3) {
        uVar3 = _result_type[i_9];
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(this->current_block->super_IVariant).self);
        notify_variable_access(this,uVar3,uVar4);
      }
    }
    break;
  case OpSelect:
    for (var_6._4_4_ = 1; var_6._4_4_ < result_id; var_6._4_4_ = var_6._4_4_ + 1) {
      if ((2 < var_6._4_4_) &&
         (local_268 = maybe_get_backing_variable(this->compiler,_result_type[var_6._4_4_]),
         local_268 != (SPIRVariable *)0x0)) {
        local_26c = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(local_268->super_IVariant).self);
        ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                 ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->accessed_variables_to_block,&local_26c);
        local_288._24_4_ =
             TypedID::operator_cast_to_unsigned_int
                       ((TypedID *)&(this->current_block->super_IVariant).self);
        local_288._8_8_ =
             ::std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)(local_288 + 0x18),__x_16);
        local_288._4_4_ =
             TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_268->super_IVariant).self);
        ppVar9 = (pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                 ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->partial_write_variables_to_block,(key_type *)(local_288 + 4));
        local_288._0_4_ =
             TypedID::operator_cast_to_unsigned_int
                       ((TypedID *)&(this->current_block->super_IVariant).self);
        _extension_set =
             ::std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::insert(ppVar9,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)local_288,__x_17);
      }
      uVar3 = _result_type[var_6._4_4_];
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(this->current_block->super_IVariant).self);
      notify_variable_access(this,uVar3,uVar4);
    }
  }
  return true;
}

Assistant:

bool Compiler::AnalyzeVariableScopeAccessHandler::handle(spv::Op op, const uint32_t *args, uint32_t length)
{
	// Keep track of the types of temporaries, so we can hoist them out as necessary.
	uint32_t result_type = 0, result_id = 0;
	if (compiler.instruction_to_result_type(result_type, result_id, op, args, length))
	{
		// For some opcodes, we will need to override the result id.
		// If we need to hoist the temporary, the temporary type is the input, not the result.
		if (op == OpConvertUToAccelerationStructureKHR)
		{
			auto itr = result_id_to_type.find(args[2]);
			if (itr != result_id_to_type.end())
				result_type = itr->second;
		}

		result_id_to_type[result_id] = result_type;
	}

	switch (op)
	{
	case OpStore:
	{
		if (length < 2)
			return false;

		ID ptr = args[0];
		auto *var = compiler.maybe_get_backing_variable(ptr);

		// If we store through an access chain, we have a partial write.
		if (var)
		{
			accessed_variables_to_block[var->self].insert(current_block->self);
			if (var->self == ptr)
				complete_write_variables_to_block[var->self].insert(current_block->self);
			else
				partial_write_variables_to_block[var->self].insert(current_block->self);
		}

		// args[0] might be an access chain we have to track use of.
		notify_variable_access(args[0], current_block->self);
		// Might try to store a Phi variable here.
		notify_variable_access(args[1], current_block->self);
		break;
	}

	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
	{
		if (length < 3)
			return false;

		// Access chains used in multiple blocks mean hoisting all the variables used to construct the access chain as not all backends can use pointers.
		uint32_t ptr = args[2];
		auto *var = compiler.maybe_get<SPIRVariable>(ptr);
		if (var)
		{
			accessed_variables_to_block[var->self].insert(current_block->self);
			rvalue_forward_children[args[1]].insert(var->self);
		}

		// args[2] might be another access chain we have to track use of.
		for (uint32_t i = 2; i < length; i++)
		{
			notify_variable_access(args[i], current_block->self);
			rvalue_forward_children[args[1]].insert(args[i]);
		}

		// Also keep track of the access chain pointer itself.
		// In exceptionally rare cases, we can end up with a case where
		// the access chain is generated in the loop body, but is consumed in continue block.
		// This means we need complex loop workarounds, and we must detect this via CFG analysis.
		notify_variable_access(args[1], current_block->self);

		// The result of an access chain is a fixed expression and is not really considered a temporary.
		auto &e = compiler.set<SPIRExpression>(args[1], "", args[0], true);
		auto *backing_variable = compiler.maybe_get_backing_variable(ptr);
		e.loaded_from = backing_variable ? VariableID(backing_variable->self) : VariableID(0);

		// Other backends might use SPIRAccessChain for this later.
		compiler.ir.ids[args[1]].set_allow_type_rewrite();
		access_chain_expressions.insert(args[1]);
		break;
	}

	case OpCopyMemory:
	{
		if (length < 2)
			return false;

		ID lhs = args[0];
		ID rhs = args[1];
		auto *var = compiler.maybe_get_backing_variable(lhs);

		// If we store through an access chain, we have a partial write.
		if (var)
		{
			accessed_variables_to_block[var->self].insert(current_block->self);
			if (var->self == lhs)
				complete_write_variables_to_block[var->self].insert(current_block->self);
			else
				partial_write_variables_to_block[var->self].insert(current_block->self);
		}

		// args[0:1] might be access chains we have to track use of.
		for (uint32_t i = 0; i < 2; i++)
			notify_variable_access(args[i], current_block->self);

		var = compiler.maybe_get_backing_variable(rhs);
		if (var)
			accessed_variables_to_block[var->self].insert(current_block->self);
		break;
	}

	case OpCopyObject:
	{
		// OpCopyObject copies the underlying non-pointer type, 
		// so any temp variable should be declared using the underlying type.
		// If the type is a pointer, get its base type and overwrite the result type mapping.
		auto &type = compiler.get<SPIRType>(result_type);
		if (type.pointer)
			result_id_to_type[result_id] = type.parent_type;

		if (length < 3)
			return false;

		auto *var = compiler.maybe_get_backing_variable(args[2]);
		if (var)
			accessed_variables_to_block[var->self].insert(current_block->self);

		// Might be an access chain which we have to keep track of.
		notify_variable_access(args[1], current_block->self);
		if (access_chain_expressions.count(args[2]))
			access_chain_expressions.insert(args[1]);

		// Might try to copy a Phi variable here.
		notify_variable_access(args[2], current_block->self);
		break;
	}

	case OpLoad:
	{
		if (length < 3)
			return false;
		uint32_t ptr = args[2];
		auto *var = compiler.maybe_get_backing_variable(ptr);
		if (var)
			accessed_variables_to_block[var->self].insert(current_block->self);

		// Loaded value is a temporary.
		notify_variable_access(args[1], current_block->self);

		// Might be an access chain we have to track use of.
		notify_variable_access(args[2], current_block->self);

		// If we're loading an opaque type we cannot lower it to a temporary,
		// we must defer access of args[2] until it's used.
		auto &type = compiler.get<SPIRType>(args[0]);
		if (compiler.type_is_opaque_value(type))
			rvalue_forward_children[args[1]].insert(args[2]);
		break;
	}

	case OpFunctionCall:
	{
		if (length < 3)
			return false;

		// Return value may be a temporary.
		if (compiler.get_type(args[0]).basetype != SPIRType::Void)
			notify_variable_access(args[1], current_block->self);

		length -= 3;
		args += 3;

		for (uint32_t i = 0; i < length; i++)
		{
			auto *var = compiler.maybe_get_backing_variable(args[i]);
			if (var)
			{
				accessed_variables_to_block[var->self].insert(current_block->self);
				// Assume we can get partial writes to this variable.
				partial_write_variables_to_block[var->self].insert(current_block->self);
			}

			// Cannot easily prove if argument we pass to a function is completely written.
			// Usually, functions write to a dummy variable,
			// which is then copied to in full to the real argument.

			// Might try to copy a Phi variable here.
			notify_variable_access(args[i], current_block->self);
		}
		break;
	}

	case OpSelect:
	{
		// In case of variable pointers, we might access a variable here.
		// We cannot prove anything about these accesses however.
		for (uint32_t i = 1; i < length; i++)
		{
			if (i >= 3)
			{
				auto *var = compiler.maybe_get_backing_variable(args[i]);
				if (var)
				{
					accessed_variables_to_block[var->self].insert(current_block->self);
					// Assume we can get partial writes to this variable.
					partial_write_variables_to_block[var->self].insert(current_block->self);
				}
			}

			// Might try to copy a Phi variable here.
			notify_variable_access(args[i], current_block->self);
		}
		break;
	}

	case OpExtInst:
	{
		for (uint32_t i = 4; i < length; i++)
			notify_variable_access(args[i], current_block->self);
		notify_variable_access(args[1], current_block->self);

		uint32_t extension_set = args[2];
		if (compiler.get<SPIRExtension>(extension_set).ext == SPIRExtension::GLSL)
		{
			auto op_450 = static_cast<GLSLstd450>(args[3]);
			switch (op_450)
			{
			case GLSLstd450Modf:
			case GLSLstd450Frexp:
			{
				uint32_t ptr = args[5];
				auto *var = compiler.maybe_get_backing_variable(ptr);
				if (var)
				{
					accessed_variables_to_block[var->self].insert(current_block->self);
					if (var->self == ptr)
						complete_write_variables_to_block[var->self].insert(current_block->self);
					else
						partial_write_variables_to_block[var->self].insert(current_block->self);
				}
				break;
			}

			default:
				break;
			}
		}
		break;
	}

	case OpArrayLength:
		// Only result is a temporary.
		notify_variable_access(args[1], current_block->self);
		break;

	case OpLine:
	case OpNoLine:
		// Uses literals, but cannot be a phi variable or temporary, so ignore.
		break;

		// Atomics shouldn't be able to access function-local variables.
		// Some GLSL builtins access a pointer.

	case OpCompositeInsert:
	case OpVectorShuffle:
		// Specialize for opcode which contains literals.
		for (uint32_t i = 1; i < 4; i++)
			notify_variable_access(args[i], current_block->self);
		break;

	case OpCompositeExtract:
		// Specialize for opcode which contains literals.
		for (uint32_t i = 1; i < 3; i++)
			notify_variable_access(args[i], current_block->self);
		break;

	case OpImageWrite:
		for (uint32_t i = 0; i < length; i++)
		{
			// Argument 3 is a literal.
			if (i != 3)
				notify_variable_access(args[i], current_block->self);
		}
		break;

	case OpImageSampleImplicitLod:
	case OpImageSampleExplicitLod:
	case OpImageSparseSampleImplicitLod:
	case OpImageSparseSampleExplicitLod:
	case OpImageSampleProjImplicitLod:
	case OpImageSampleProjExplicitLod:
	case OpImageSparseSampleProjImplicitLod:
	case OpImageSparseSampleProjExplicitLod:
	case OpImageFetch:
	case OpImageSparseFetch:
	case OpImageRead:
	case OpImageSparseRead:
		for (uint32_t i = 1; i < length; i++)
		{
			// Argument 4 is a literal.
			if (i != 4)
				notify_variable_access(args[i], current_block->self);
		}
		break;

	case OpImageSampleDrefImplicitLod:
	case OpImageSampleDrefExplicitLod:
	case OpImageSparseSampleDrefImplicitLod:
	case OpImageSparseSampleDrefExplicitLod:
	case OpImageSampleProjDrefImplicitLod:
	case OpImageSampleProjDrefExplicitLod:
	case OpImageSparseSampleProjDrefImplicitLod:
	case OpImageSparseSampleProjDrefExplicitLod:
	case OpImageGather:
	case OpImageSparseGather:
	case OpImageDrefGather:
	case OpImageSparseDrefGather:
		for (uint32_t i = 1; i < length; i++)
		{
			// Argument 5 is a literal.
			if (i != 5)
				notify_variable_access(args[i], current_block->self);
		}
		break;

	default:
	{
		// Rather dirty way of figuring out where Phi variables are used.
		// As long as only IDs are used, we can scan through instructions and try to find any evidence that
		// the ID of a variable has been used.
		// There are potential false positives here where a literal is used in-place of an ID,
		// but worst case, it does not affect the correctness of the compile.
		// Exhaustive analysis would be better here, but it's not worth it for now.
		for (uint32_t i = 0; i < length; i++)
			notify_variable_access(args[i], current_block->self);
		break;
	}
	}
	return true;
}